

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void fullsize_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY output_data)

{
  JSAMPARRAY in_RCX;
  long in_RSI;
  long in_RDI;
  JSAMPARRAY unaff_retaddr;
  
  jcopy_sample_rows(input_data,output_data._4_4_,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                    (int)in_RDI,(JDIMENSION)((ulong)in_RSI >> 0x20));
  expand_right_edge(in_RCX,*(int *)(in_RDI + 0x160),*(JDIMENSION *)(in_RDI + 0x30),
                    *(int *)(in_RSI + 0x1c) * *(int *)(in_RSI + 0x24));
  return;
}

Assistant:

METHODDEF(void)
fullsize_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		     JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  /* Copy the data */
  jcopy_sample_rows(input_data, 0, output_data, 0,
		    cinfo->max_v_samp_factor, cinfo->image_width);
  /* Edge-expand */
  expand_right_edge(output_data, cinfo->max_v_samp_factor, cinfo->image_width,
		    compptr->width_in_blocks * compptr->DCT_h_scaled_size);
}